

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O1

void __thiscall
netlist::NetlistVariableDeclaration::~NetlistVariableDeclaration(NetlistVariableDeclaration *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer p;
  pointer p_00;
  
  (this->super_NetlistNode).super_Node<netlist::NetlistNode,_netlist::NetlistEdge>._vptr_Node =
       (_func_int **)&PTR__NetlistVariableDeclaration_005d1158;
  p = (this->aliases).
      super__Vector_base<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
      ._M_impl.super__Vector_impl_data._M_start;
  if (p != (pointer)0x0) {
    operator_delete(p,(long)(this->aliases).
                            super__Vector_base<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)p);
  }
  p_00 = (this->hierarchicalPath)._M_dataplus._M_p;
  paVar1 = &(this->hierarchicalPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p_00 != paVar1) {
    operator_delete(p_00,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_NetlistNode).super_Node<netlist::NetlistNode,_netlist::NetlistEdge>._vptr_Node =
       (_func_int **)&PTR__Node_005d11d8;
  std::
  vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>
  ::~vector(&(this->super_NetlistNode).super_Node<netlist::NetlistNode,_netlist::NetlistEdge>.edges)
  ;
  return;
}

Assistant:

NetlistVariableDeclaration(const ast::Symbol& symbol) :
        NetlistNode(NodeKind::VariableDeclaration, symbol) {}